

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compressWeights(void *dst,size_t dstSize,void *weightTable,size_t wtSize)

{
  uint uVar1;
  void *buffer;
  void *code;
  ulong in_RCX;
  size_t cSize;
  size_t _var_err___1;
  size_t hSize;
  size_t _var_err__;
  uint maxCount;
  S16 norm [13];
  U32 count [13];
  BYTE scratchBuffer [64];
  FSE_CTable CTable [59];
  U32 tableLog;
  U32 maxSymbolValue;
  BYTE *oend;
  BYTE *op;
  BYTE *ostart;
  size_t in_stack_00000278;
  void *in_stack_00000280;
  uint in_stack_00000288;
  uint in_stack_0000028c;
  short *in_stack_00000290;
  FSE_CTable *in_stack_00000298;
  FSE_CTable *in_stack_fffffffffffffdf8;
  size_t in_stack_fffffffffffffe00;
  short *in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  void *dstSize_00;
  void *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  uint *in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe3c;
  size_t in_stack_fffffffffffffe40;
  uint *in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe54;
  short *in_stack_fffffffffffffe58;
  undefined8 local_8;
  
  if (in_RCX < 2) {
    local_8 = (void *)0x0;
  }
  else {
    uVar1 = HIST_count_simple(in_stack_fffffffffffffe28,
                              (uint *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    if (uVar1 == in_RCX) {
      local_8 = (void *)0x1;
    }
    else if (uVar1 == 1) {
      local_8 = (void *)0x0;
    }
    else {
      FSE_optimalTableLog((uint)(in_stack_fffffffffffffe00 >> 0x20),
                          (size_t)in_stack_fffffffffffffdf8,0);
      buffer = (void *)FSE_normalizeCount(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                                          in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                          in_stack_fffffffffffffe3c);
      uVar1 = ERR_isError((size_t)buffer);
      local_8 = buffer;
      if (uVar1 == 0) {
        code = (void *)FSE_writeNCount(buffer,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                                       (uint)(in_stack_fffffffffffffe00 >> 0x20),
                                       (uint)in_stack_fffffffffffffe00);
        uVar1 = ERR_isError((size_t)code);
        local_8 = code;
        if (uVar1 == 0) {
          dstSize_00 = code;
          local_8 = (void *)FSE_buildCTable_wksp
                                      (in_stack_00000298,in_stack_00000290,in_stack_0000028c,
                                       in_stack_00000288,in_stack_00000280,in_stack_00000278);
          uVar1 = ERR_isError((size_t)local_8);
          if (uVar1 == 0) {
            local_8 = (void *)FSE_compress_usingCTable
                                        (buffer,(size_t)dstSize_00,local_8,in_stack_fffffffffffffe00
                                         ,in_stack_fffffffffffffdf8);
            uVar1 = ERR_isError((size_t)local_8);
            if (uVar1 == 0) {
              if (local_8 == (void *)0x0) {
                local_8 = (void *)0x0;
              }
              else {
                local_8 = (void *)((long)local_8 + (long)code);
              }
            }
          }
        }
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

size_t HUF_compressWeights (void* dst, size_t dstSize, const void* weightTable, size_t wtSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    U32 maxSymbolValue = HUF_TABLELOG_MAX;
    U32 tableLog = MAX_FSE_TABLELOG_FOR_HUFF_HEADER;

    FSE_CTable CTable[FSE_CTABLE_SIZE_U32(MAX_FSE_TABLELOG_FOR_HUFF_HEADER, HUF_TABLELOG_MAX)];
    BYTE scratchBuffer[1<<MAX_FSE_TABLELOG_FOR_HUFF_HEADER];

    U32 count[HUF_TABLELOG_MAX+1];
    S16 norm[HUF_TABLELOG_MAX+1];

    /* init conditions */
    if (wtSize <= 1) return 0;  /* Not compressible */

    /* Scan input and build symbol stats */
    {   unsigned const maxCount = HIST_count_simple(count, &maxSymbolValue, weightTable, wtSize);   /* never fails */
        if (maxCount == wtSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;        /* each symbol present maximum once => not compressible */
    }

    tableLog = FSE_optimalTableLog(tableLog, wtSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, wtSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(hSize, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += hSize;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, sizeof(scratchBuffer)) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, weightTable, wtSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    return op-ostart;
}